

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_and_array.cpp
# Opt level: O3

int vector_and_array(void)

{
  undefined8 *puVar1;
  ostream *poVar2;
  double a1 [4];
  array<double,_4UL> a4;
  array<double,_4UL> a3;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = 0x3ff199999999999a;
  puVar1[1] = 0x3ff3333333333333;
  puVar1[2] = 0x3ff4cccccccccccd;
  puVar1[3] = 0x3ff6666666666666;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a1[2]: ",7);
  poVar2 = std::ostream::_M_insert<double>(3.6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a2[2]: ",7);
  poVar2 = std::ostream::_M_insert<double>((double)puVar1[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a3[2]: ",7);
  poVar2 = std::ostream::_M_insert<double>(0.3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a4[2]: ",7);
  poVar2 = std::ostream::_M_insert<double>(0.3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a1[-2]: ",8);
  poVar2 = std::ostream::_M_insert<double>(11.3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a2[2]: ",7);
  poVar2 = std::ostream::_M_insert<double>((double)puVar1[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a3[2]: ",7);
  poVar2 = std::ostream::_M_insert<double>(0.3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a4[2]: ",7);
  poVar2 = std::ostream::_M_insert<double>(0.3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at ",4);
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  operator_delete(puVar1);
  return 0;
}

Assistant:

int vector_and_array () {
    using namespace std;
    //  default array, in "stack"
    double a1[4] = {1.2, 2.4, 3.6, 4.8};

    //  vector, use "heap" to store data
    vector<double> a2(4);
    a2[0] = 1.1;
    a2[1] = 1.2;
    a2[2] = 1.3;
    a2[3] = 1.4;

    //  array in c++11, use "stack" to store data
    array<double, 4> a3 = {0.1, 0.2, 0.3, 0.4};
    array<double, 4> a4 = a3;

    cout << "a1[2]: " << a1[2] << " at " << &a1[2] << endl;
    cout << "a2[2]: " << a2[2] << " at " << &a2[2] << endl;
    cout << "a3[2]: " << a3[2] << " at " << &a3[2] << endl;
    cout << "a4[2]: " << a4[2] << " at " << &a4[2] << endl;

    //  danger operation
    a1[-2] = 11.3;

    cout << "a1[-2]: " << a1[-2] << " at " << &a1[-2] << endl;
    cout << "a2[2]: " << a2[2] << " at " << &a2[2] << endl;
    cout << "a3[2]: " << a3[2] << " at " << &a3[2] << endl;
    cout << "a4[2]: " << a4[2] << " at " << &a4[2] << endl;

    return 0;
}